

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__encode_uint8_srgb2_linearalpha_AR(void *outputp,int width_times_channels,float *encode)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  stbir_uint8 sVar17;
  uchar *puVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float local_71c;
  ulong uStack_718;
  float f;
  __m128i temp_1;
  __m128i temp;
  stbir__simdi_u32 temp1;
  stbir__simdi_u32 temp0;
  __m128 tmp3;
  __m128 tmp2;
  __m128 tmp1;
  __m128 tmp0;
  __m128i i3;
  __m128i i2;
  __m128i i1;
  __m128i i0;
  __m128 f3;
  __m128 f2;
  __m128 f1;
  __m128 f0;
  float *end_encode_m16;
  uchar *end_output;
  uchar *output;
  float *encode_local;
  int width_times_channels_local;
  void *outputp_local;
  short local_5a8;
  short sStack_5a6;
  short sStack_5a4;
  short sStack_5a2;
  short local_598;
  short sStack_596;
  short sStack_594;
  short sStack_592;
  short sStack_4e0;
  short sStack_4de;
  short sStack_4dc;
  short sStack_4da;
  short sStack_4d0;
  short sStack_4ce;
  short sStack_4cc;
  short sStack_4ca;
  undefined4 local_448;
  float fStack_444;
  undefined4 local_438;
  float fStack_434;
  undefined4 local_428;
  float fStack_424;
  undefined4 local_418;
  float fStack_414;
  undefined4 uStack_400;
  float fStack_3fc;
  undefined4 uStack_3f0;
  float fStack_3ec;
  undefined4 uStack_3e0;
  float fStack_3dc;
  undefined4 uStack_3d0;
  float fStack_3cc;
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  puVar18 = (uchar *)((long)outputp + (long)width_times_channels);
  end_output = (uchar *)outputp;
  output = (uchar *)encode;
  if (width_times_channels < 0x10) {
    do {
      sVar17 = stbir__linear_to_srgb_uchar(*(float *)output);
      end_output[1] = sVar17;
      local_71c = *(float *)(output + 4) * 255.0 + 0.5;
      if (local_71c < 0.0) {
        local_71c = 0.0;
      }
      if (255.0 < local_71c) {
        local_71c = 255.0;
      }
      *end_output = (uchar)(int)local_71c;
      end_output = end_output + 2;
      output = output + 8;
    } while (end_output < puVar18);
  }
  else {
    end_output = (uchar *)outputp;
    output = (uchar *)encode;
    do {
      do {
        local_418 = (undefined4)*(undefined8 *)output;
        fStack_414 = (float)((ulong)*(undefined8 *)output >> 0x20);
        local_428 = (undefined4)*(undefined8 *)(output + 0x10);
        fStack_424 = (float)((ulong)*(undefined8 *)(output + 0x10) >> 0x20);
        local_438 = (undefined4)*(undefined8 *)(output + 0x20);
        fStack_434 = (float)((ulong)*(undefined8 *)(output + 0x20) >> 0x20);
        local_448 = (undefined4)*(undefined8 *)(output + 0x30);
        fStack_444 = (float)((ulong)*(undefined8 *)(output + 0x30) >> 0x20);
        uStack_3d0 = (undefined4)*(undefined8 *)(output + 8);
        fStack_3cc = (float)((ulong)*(undefined8 *)(output + 8) >> 0x20);
        uStack_3e0 = (undefined4)*(undefined8 *)(output + 0x18);
        fStack_3dc = (float)((ulong)*(undefined8 *)(output + 0x18) >> 0x20);
        uStack_3f0 = (undefined4)*(undefined8 *)(output + 0x28);
        fStack_3ec = (float)((ulong)*(undefined8 *)(output + 0x28) >> 0x20);
        uStack_400 = (undefined4)*(undefined8 *)(output + 0x38);
        fStack_3fc = (float)((ulong)*(undefined8 *)(output + 0x38) >> 0x20);
        auVar4._4_4_ = local_428;
        auVar4._0_4_ = local_418;
        auVar4._12_4_ = local_448;
        auVar4._8_4_ = local_438;
        auVar1._4_4_ = uStack_3e0;
        auVar1._0_4_ = uStack_3d0;
        auVar1._12_4_ = uStack_400;
        auVar1._8_4_ = uStack_3f0;
        auVar3._8_8_ = 0x3900000039000000;
        auVar3._0_8_ = 0x3900000039000000;
        auVar20 = maxps(auVar4,auVar3);
        auVar8._8_8_ = 0x3f7fffff3f7fffff;
        auVar8._0_8_ = 0x3f7fffff3f7fffff;
        auVar20 = minps(auVar20,auVar8);
        local_198 = auVar20._0_4_;
        uStack_194 = auVar20._4_4_;
        uStack_190 = auVar20._8_4_;
        uStack_18c = auVar20._12_4_;
        f2[2] = fStack_414 * 255.0 + 0.5;
        f2[3] = fStack_424 * 255.0 + 0.5;
        f1[0] = fStack_434 * 255.0 + 0.5;
        f1[1] = fStack_444 * 255.0 + 0.5;
        auVar2._8_4_ = f1[0];
        auVar2._12_4_ = f1[1];
        auVar2._0_4_ = f2[2];
        auVar2._4_4_ = f2[3];
        auVar20 = maxps(auVar2,ZEXT816(0));
        auVar7._8_8_ = 0x437f0000437f0000;
        auVar7._0_8_ = 0x437f0000437f0000;
        auVar20 = minps(auVar20,auVar7);
        local_18 = auVar20._0_4_;
        fStack_14 = auVar20._4_4_;
        fStack_10 = auVar20._8_4_;
        fStack_c = auVar20._12_4_;
        i2[1] = CONCAT44((int)fStack_14,(int)local_18);
        i1[0]._0_4_ = (int)fStack_10;
        i1[0]._4_4_ = (int)fStack_c;
        auVar21._8_8_ = 0x3900000039000000;
        auVar21._0_8_ = 0x3900000039000000;
        auVar20 = maxps(auVar1,auVar21);
        auVar6._8_8_ = 0x3f7fffff3f7fffff;
        auVar6._0_8_ = 0x3f7fffff3f7fffff;
        auVar20 = minps(auVar20,auVar6);
        local_1b8 = auVar20._0_4_;
        uStack_1b4 = auVar20._4_4_;
        uStack_1b0 = auVar20._8_4_;
        uStack_1ac = auVar20._12_4_;
        i0[1] = CONCAT44(fStack_3dc * 255.0 + 0.5,fStack_3cc * 255.0 + 0.5);
        f3[0] = fStack_3ec * 255.0 + 0.5;
        f3[1] = fStack_3fc * 255.0 + 0.5;
        auVar20._8_4_ = f3[0];
        auVar20._12_4_ = f3[1];
        auVar20._0_8_ = i0[1];
        auVar20 = maxps(auVar20,ZEXT816(0));
        auVar5._8_8_ = 0x437f0000437f0000;
        auVar5._0_8_ = 0x437f0000437f0000;
        auVar20 = minps(auVar20,auVar5);
        local_28 = auVar20._0_4_;
        fStack_24 = auVar20._4_4_;
        fStack_20 = auVar20._8_4_;
        fStack_1c = auVar20._12_4_;
        tmp0[3] = (float)(int)fStack_24;
        tmp0[2] = (float)(int)local_28;
        i3[0]._0_4_ = (int)fStack_20;
        i3[0]._4_4_ = (int)fStack_1c;
        temp1.m128i_u32[3] = (&DAT_009fdfb0)[(int)(uStack_194 >> 0x14)];
        temp1.m128i_u32[2] = (&DAT_009fdfb0)[(int)(local_198 >> 0x14)];
        temp0.m128i_u32[1] = (&DAT_009fdfb0)[(int)(uStack_18c >> 0x14)];
        temp0.m128i_u32[0] = (&DAT_009fdfb0)[(int)(uStack_190 >> 0x14)];
        temp[1] = CONCAT44((&DAT_009fdfb0)[(int)(uStack_1b4 >> 0x14)],
                           (&DAT_009fdfb0)[(int)(local_1b8 >> 0x14)]);
        temp1.m128i_u32[1] = (&DAT_009fdfb0)[(int)(uStack_1ac >> 0x14)];
        temp1.m128i_u32[0] = (&DAT_009fdfb0)[(int)(uStack_1b0 >> 0x14)];
        temp_1[1] = CONCAT44(uStack_194 >> 0xc,local_198 >> 0xc);
        temp[0] = CONCAT44(uStack_18c >> 0xc,uStack_190 >> 0xc);
        auVar12._8_8_ = temp0.m128i_i128[0];
        auVar12._0_8_ = temp1.m128i_i128[1];
        auVar11._8_8_ = temp[0] & 0xff000000ffU | 0x200000002000000;
        auVar11._0_8_ = temp_1[1] & 0xff000000ffU | 0x200000002000000;
        auVar20 = pmaddwd(auVar12,auVar11);
        local_1f8 = auVar20._0_4_;
        uStack_1f4 = auVar20._4_4_;
        uStack_1f0 = auVar20._8_4_;
        uStack_1ec = auVar20._12_4_;
        i1[1] = CONCAT44(uStack_1f4 >> 0x10,local_1f8 >> 0x10);
        i0[0]._0_4_ = uStack_1f0 >> 0x10;
        i0[0]._4_4_ = uStack_1ec >> 0x10;
        uStack_718 = CONCAT44(uStack_1b4 >> 0xc,local_1b8 >> 0xc);
        temp_1[0] = CONCAT44(uStack_1ac >> 0xc,uStack_1b0 >> 0xc);
        auVar10._8_8_ = temp1.m128i_i128[0];
        auVar10._0_8_ = temp[1];
        auVar9._8_8_ = temp_1[0] & 0xff000000ffU | 0x200000002000000;
        auVar9._0_8_ = uStack_718 & 0xff000000ff | 0x200000002000000;
        auVar20 = pmaddwd(auVar10,auVar9);
        local_238 = auVar20._0_4_;
        uStack_234 = auVar20._4_4_;
        uStack_230 = auVar20._8_4_;
        uStack_22c = auVar20._12_4_;
        i3[1] = CONCAT44(uStack_234 >> 0x10,local_238 >> 0x10);
        i2[0]._0_4_ = uStack_230 >> 0x10;
        i2[0]._4_4_ = uStack_22c >> 0x10;
        auVar16._8_8_ = i1[0];
        auVar16._0_8_ = i2[1];
        auVar15._8_8_ = i0[0];
        auVar15._0_8_ = i1[1];
        auVar20 = packssdw(auVar16,auVar15);
        auVar14._8_8_ = i3[0];
        auVar14._0_4_ = (int)local_28;
        auVar14._4_4_ = (int)fStack_24;
        auVar13._8_8_ = i2[0];
        auVar13._0_8_ = i3[1];
        auVar21 = packssdw(auVar14,auVar13);
        local_598 = auVar20._0_2_;
        sStack_596 = auVar20._2_2_;
        sStack_594 = auVar20._4_2_;
        sStack_592 = auVar20._6_2_;
        local_5a8 = auVar21._0_2_;
        sStack_5a6 = auVar21._2_2_;
        sStack_5a4 = auVar21._4_2_;
        sStack_5a2 = auVar21._6_2_;
        sStack_4d0 = auVar20._8_2_;
        sStack_4ce = auVar20._10_2_;
        sStack_4cc = auVar20._12_2_;
        sStack_4ca = auVar20._14_2_;
        sStack_4e0 = auVar21._8_2_;
        sStack_4de = auVar21._10_2_;
        sStack_4dc = auVar21._12_2_;
        sStack_4da = auVar21._14_2_;
        i2[1] = CONCAT17((0 < sStack_4de) * (sStack_4de < 0x100) * auVar21[10] - (0xff < sStack_4de)
                         ,CONCAT16((0 < sStack_5a6) * (sStack_5a6 < 0x100) * auVar21[2] -
                                   (0xff < sStack_5a6),
                                   CONCAT15((0 < sStack_4ce) * (sStack_4ce < 0x100) * auVar20[10] -
                                            (0xff < sStack_4ce),
                                            CONCAT14((0 < sStack_596) * (sStack_596 < 0x100) *
                                                     auVar20[2] - (0xff < sStack_596),
                                                     CONCAT13((0 < sStack_4e0) *
                                                              (sStack_4e0 < 0x100) * auVar21[8] -
                                                              (0xff < sStack_4e0),
                                                              CONCAT12((0 < local_5a8) *
                                                                       (local_5a8 < 0x100) *
                                                                       auVar21[0] -
                                                                       (0xff < local_5a8),
                                                                       CONCAT11((0 < sStack_4d0) *
                                                                                (sStack_4d0 < 0x100)
                                                                                * auVar20[8] -
                                                                                (0xff < sStack_4d0),
                                                                                (0 < local_598) *
                                                                                (local_598 < 0x100)
                                                                                * auVar20[0] -
                                                                                (0xff < local_598)))
                                                             )))));
        i1[0]._0_1_ = (0 < sStack_594) * (sStack_594 < 0x100) * auVar20[4] - (0xff < sStack_594);
        i1[0]._1_1_ = (0 < sStack_4cc) * (sStack_4cc < 0x100) * auVar20[0xc] - (0xff < sStack_4cc);
        i1[0]._2_1_ = (0 < sStack_5a4) * (sStack_5a4 < 0x100) * auVar21[4] - (0xff < sStack_5a4);
        i1[0]._3_1_ = (0 < sStack_4dc) * (sStack_4dc < 0x100) * auVar21[0xc] - (0xff < sStack_4dc);
        i1[0]._4_1_ = (0 < sStack_592) * (sStack_592 < 0x100) * auVar20[6] - (0xff < sStack_592);
        i1[0]._5_1_ = (0 < sStack_4ca) * (sStack_4ca < 0x100) * auVar20[0xe] - (0xff < sStack_4ca);
        i1[0]._6_1_ = (0 < sStack_5a2) * (sStack_5a2 < 0x100) * auVar21[6] - (0xff < sStack_5a2);
        i1[0]._7_1_ = (0 < sStack_4da) * (sStack_4da < 0x100) * auVar21[0xe] - (0xff < sStack_4da);
        *(longlong *)end_output = i2[1];
        *(longlong *)(end_output + 8) = i1[0];
        end_output = end_output + 0x10;
        output = output + 0x40;
      } while (end_output <= puVar18 + -0x10);
      bVar19 = end_output != puVar18;
      end_output = puVar18 + -0x10;
      output = (uchar *)(encode + (long)width_times_channels + -0x10);
    } while (bVar19);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_srgb2_linearalpha )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char*) outputp;
  unsigned char * end_output = ( (unsigned char*) output ) + width_times_channels;

  #ifdef STBIR_SIMD

  if ( width_times_channels >= 16 )
  {
    float const * end_encode_m16 = encode + width_times_channels - 16;
    end_output -= 16;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdf f0, f1, f2, f3;
      stbir__simdi i0, i1, i2, i3;

      STBIR_SIMD_NO_UNROLL(encode);
      stbir__simdf_load4_transposed( f0, f1, f2, f3, encode );

      stbir__min_max_shift20( i0, f0 );
      stbir__scale_and_convert( i1, f1 );
      stbir__min_max_shift20( i2, f2 );
      stbir__scale_and_convert( i3, f3 );

      stbir__simdi_table_lookup2( i0, i2, ( fp32_to_srgb8_tab4 - (127-13)*8 ) );

      stbir__linear_to_srgb_finish( i0, f0 );
      stbir__linear_to_srgb_finish( i2, f2 );

      stbir__interleave_pack_and_store_16_u8( output,  STBIR_strs_join1(i, ,stbir__encode_order0), STBIR_strs_join1(i, ,stbir__encode_order1), STBIR_strs_join1(i, ,stbir__encode_order2), STBIR_strs_join1(i, ,stbir__encode_order3) );

      output += 16;
      encode += 16;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 16 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m16;
    }
    return;
  }
  #endif

  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float f;
    STBIR_SIMD_NO_UNROLL(encode);

    output[stbir__decode_order0] = stbir__linear_to_srgb_uchar( encode[0] );

    f = encode[1] * stbir__max_uint8_as_float + 0.5f;
    STBIR_CLAMP(f, 0, 255);
    output[stbir__decode_order1] = (unsigned char) f;

    output += 2;
    encode += 2;
  } while( output < end_output );
}